

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3UpsertDelete(sqlite3 *db,Upsert *p)

{
  Upsert *p_local;
  sqlite3 *db_local;
  
  if (p != (Upsert *)0x0) {
    sqlite3ExprListDelete(db,p->pUpsertTarget);
    sqlite3ExprDelete(db,p->pUpsertTargetWhere);
    sqlite3ExprListDelete(db,p->pUpsertSet);
    sqlite3ExprDelete(db,p->pUpsertWhere);
    sqlite3DbFree(db,p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDelete(sqlite3 *db, Upsert *p){
  if( p ){
    sqlite3ExprListDelete(db, p->pUpsertTarget);
    sqlite3ExprDelete(db, p->pUpsertTargetWhere);
    sqlite3ExprListDelete(db, p->pUpsertSet);
    sqlite3ExprDelete(db, p->pUpsertWhere);
    sqlite3DbFree(db, p);
  }
}